

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

void __thiscall
USBControlTransferParser::ParseDataPacket(USBControlTransferParser *this,USBPacket *packet)

{
  USBAnalyzerResults *pUVar1;
  bool bVar2;
  U32 UVar3;
  USBDescriptorType UVar4;
  USBCDCDescriptorSubtype UVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  undefined1 local_d0 [7];
  bool detected_complete_descriptor;
  undefined1 local_a8 [40];
  undefined1 local_80 [56];
  undefined1 local_48 [55];
  U8 interfaceClass;
  USBPacket *packet_local;
  USBControlTransferParser *this_local;
  
  this->pPacket = packet;
  this->mPacketOffset = 0;
  unique0x10000497 = packet;
  packet_local = (USBPacket *)this;
  sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&packet->mData);
  this->mPacketDataBytes = (int)sVar6 + -4;
  bVar2 = USBRequest::IsRequestedStandardDescriptor(&this->mRequest);
  if (bVar2) {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              if (this->mPacketDataBytes <= this->mPacketOffset) {
                return;
              }
              pmVar7 = std::
                       map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                       ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
              local_48[0x2f] = (char)*pmVar7;
              if (this->mParsedOffset != 0) break;
              pUVar1 = this->pResults;
              USBPacket::GetDataPayloadField
                        ((USBPacket *)local_48,(int)stack0xffffffffffffffe8,this->mPacketOffset,
                         '\x01',(char *)(ulong)this->mAddress,0x169703,'\0');
              AnalyzerResults::AddFrame((Frame *)pUVar1);
              Frame::~Frame((Frame *)local_48);
              UVar3 = USBPacket::GetDataPayload(stack0xffffffffffffffe8,this->mPacketOffset,1);
              this->mDescBytes = UVar3;
              this->mPacketOffset = this->mPacketOffset + 1;
              this->mParsedOffset = this->mParsedOffset + 1;
            }
            if (this->mParsedOffset != 1) break;
            UVar4 = USBPacket::GetDataPayload(stack0xffffffffffffffe8,this->mPacketOffset,1);
            this->mDescType = UVar4;
            bVar2 = IsStandardDescriptor((U8)this->mDescType);
            if ((((bVar2) || (local_48[0x2f] == '\x03')) || (local_48[0x2f] == '\x02')) ||
               (local_48[0x2f] == '\n')) {
              pUVar1 = this->pResults;
              USBPacket::GetDataPayloadField
                        ((USBPacket *)local_80,(int)stack0xffffffffffffffe8,this->mPacketOffset,
                         '\x01',(char *)(ulong)this->mAddress,0x1690ac,'\x0f');
              AnalyzerResults::AddFrame((Frame *)pUVar1);
              Frame::~Frame((Frame *)local_80);
            }
            else {
              pUVar1 = this->pResults;
              USBPacket::GetDataPayloadField
                        ((USBPacket *)local_a8,(int)stack0xffffffffffffffe8,this->mPacketOffset,
                         '\x01',(char *)(ulong)this->mAddress,0x1690ac,'\x10');
              AnalyzerResults::AddFrame((Frame *)pUVar1);
              Frame::~Frame((Frame *)local_a8);
            }
            this->mPacketOffset = this->mPacketOffset + 1;
            this->mParsedOffset = this->mParsedOffset + 1;
          }
          if (((this->mParsedOffset != 2) ||
              ((local_48[0x2f] != '\x02' && (local_48[0x2f] != '\n')))) ||
             ((this->mDescType != DT_CDC_CS_INTERFACE && (this->mDescType != DT_CDC_CS_ENDPOINT))))
          break;
          UVar5 = USBPacket::GetDataPayload(stack0xffffffffffffffe8,this->mPacketOffset,1);
          this->mDescSubtype = UVar5;
          pUVar1 = this->pResults;
          USBPacket::GetDataPayloadField
                    ((USBPacket *)local_d0,(int)stack0xffffffffffffffe8,this->mPacketOffset,'\x01',
                     (char *)(ulong)this->mAddress,0x1690ce,'\x1f');
          AnalyzerResults::AddFrame((Frame *)pUVar1);
          Frame::~Frame((Frame *)local_d0);
          this->mPacketOffset = this->mPacketOffset + 1;
          this->mParsedOffset = this->mParsedOffset + 1;
        }
        if (this->mDescType == DT_STRING) break;
        ParseStandardDescriptor(this);
      }
      bVar2 = ParseStringDescriptor(this);
    } while ((!bVar2) || (this->mPacketDataBytes <= this->mPacketOffset));
    poVar8 = std::operator<<((ostream *)&std::cerr,
                             "String descriptor length shorter than packet length. Packet length: ")
    ;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mPacketDataBytes);
    poVar8 = std::operator<<(poVar8," processed bytes: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mPacketOffset);
    poVar8 = std::operator<<(poVar8," reported descriptor length: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->mDescBytes);
    std::operator<<(poVar8,"\n");
  }
  else {
    bVar2 = USBRequest::IsRequestedHIDReportDescriptor(&this->mRequest);
    if (bVar2) {
      ParseHIDReportDescriptor(this);
    }
    else {
      bVar2 = IsCDCClassRequest(this);
      if (bVar2) {
        ParseCDCDataStage(this);
      }
      else {
        ParseUnknownResponse(this);
      }
    }
  }
  return;
}

Assistant:

void USBControlTransferParser::ParseDataPacket( USBPacket& packet )
{
    pPacket = &packet;
    mPacketOffset = 0;
    mPacketDataBytes = packet.mData.size() - 4;

    if( mRequest.IsRequestedStandardDescriptor() )
    {
        while( mPacketDataBytes > mPacketOffset )
        {
            U8 interfaceClass = mInterfaceClasses[ mInterfaceNumber ];

            if( mParsedOffset == 0 ) // are we just starting with this descriptor?
            {
                // handle the bLength field
                pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bLength", Fld_None, FF_DataDescriptor ) );
                mDescBytes = packet.GetDataPayload( mPacketOffset, 1 );
                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 1 )
            {
                mDescType = USBDescriptorType( packet.GetDataPayload( mPacketOffset, 1 ) );

                if( IsStandardDescriptor( mDescType ) || interfaceClass == CC_HID || interfaceClass == CC_CommunicationsAndCDCControl ||
                    interfaceClass == CC_CDCData )
                    pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType ) );
                else
                    pResults->AddFrame(
                        packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType_Other ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 2 && ( interfaceClass == CC_CommunicationsAndCDCControl || interfaceClass == CC_CDCData ) &&
                     ( mDescType == DT_CDC_CS_INTERFACE || mDescType == DT_CDC_CS_ENDPOINT ) )
            {
                mDescSubtype = USBCDCDescriptorSubtype( packet.GetDataPayload( mPacketOffset, 1 ) );
                pResults->AddFrame(
                    packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorSubtype", Fld_CDC_DescriptorSubtype ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else
            {
                if( mDescType == DT_STRING )
                {
                    bool detected_complete_descriptor = ParseStringDescriptor();
                    if( detected_complete_descriptor && mPacketDataBytes > mPacketOffset )
                    {
                        // we finished parsing the complete string descriptor, according to bLength, however there are still bytes left in
                        // the packet.
                        std::cerr << "String descriptor length shorter than packet length. Packet length: " << mPacketDataBytes
                                  << " processed bytes: " << mPacketOffset << " reported descriptor length: " << mDescBytes << "\n";
                        break;
                    }
                }
                else
                {
                    ParseStandardDescriptor();
                }
            }
        }
    }
    else if( mRequest.IsRequestedHIDReportDescriptor() )
    {
        ParseHIDReportDescriptor();
    }
    else if( IsCDCClassRequest() )
    {
        ParseCDCDataStage();
    }
    else
    {
        ParseUnknownResponse();
    }
}